

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

short duckdb::TryCastCInternal<duckdb::dtime_t,short,duckdb::TryCast>
                (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  undefined8 in_RAX;
  short result_value;
  short local_2;
  
  local_2 = (short)((ulong)in_RAX >> 0x30);
  bVar1 = TryCast::Operation<duckdb::dtime_t,short>
                    ((dtime_t)*(int64_t *)
                               ((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_2,false);
  if (!bVar1) {
    local_2 = 0;
  }
  return local_2;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}